

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O3

void __thiscall Args::CmdLine::addArg(CmdLine *this,ArgPtr *arg)

{
  ArgIface *pAVar1;
  long lVar2;
  __normal_iterator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  _Var3;
  logic_error *this_00;
  long *plVar4;
  ulong *puVar5;
  ulong *local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const>>
                    ((this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_args).
                     super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,arg);
  if (_Var3._M_current ==
      (this->m_args).
      super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pAVar1 = (arg->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    (*pAVar1->_vptr_ArgIface[0x12])(pAVar1,this);
    std::
    vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
    ::emplace_back<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>
              ((vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>
                *)&this->m_args,arg);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Argument \"","");
  (*((arg->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t
     .super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
     super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[3])(&local_68);
  std::operator+(&local_48,&local_88,&local_68);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_a8 = (ulong *)*plVar4;
  puVar5 = (ulong *)(plVar4 + 2);
  if (local_a8 == puVar5) {
    local_98 = *puVar5;
    uStack_90 = plVar4[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar5;
  }
  lVar2 = plVar4[1];
  *plVar4 = (long)puVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__BaseException_00158a10;
  *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
  if (local_a8 == &local_98) {
    *(undefined4 *)(this_00 + 0x20) = (undefined4)local_98;
    *(undefined4 *)(this_00 + 0x24) = local_98._4_4_;
    *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_90;
    *(undefined4 *)(this_00 + 0x2c) = uStack_90._4_4_;
  }
  else {
    *(ulong **)(this_00 + 0x10) = local_a8;
    *(ulong *)(this_00 + 0x20) = local_98;
  }
  *(long *)(this_00 + 0x18) = lVar2;
  local_98 = local_98 & 0xffffffffffffff00;
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

void addArg( ArgPtr arg )
	{
		if( std::find( m_args.begin(), m_args.end(), arg ) ==
			m_args.end() )
		{
			arg->setCmdLine( this );

			m_args.push_back( std::move( arg ) );
		}
		else
			throw BaseException( String( SL( "Argument \"" ) ) +
				arg->name() + SL( "\" already in the command line parser." ) );
	}